

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,int,char>
          (basic_appender<char> out,int count,char *value)

{
  int iVar1;
  basic_appender<char> local_28;
  
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  while (iVar1 != 0) {
    local_28.container = out.container;
    basic_appender<char>::operator=(&local_28,*value);
    iVar1 = iVar1 + -1;
  }
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}